

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_writer.cc
# Opt level: O2

void __thiscall leveldb::log::Writer::Writer(Writer *this,WritableFile *dest)

{
  this->dest_ = dest;
  this->block_offset_ = 0;
  InitTypeCrc(this->type_crc_);
  return;
}

Assistant:

Writer::Writer(WritableFile *dest)
                : dest_(dest),
                  block_offset_(0) {
            InitTypeCrc(type_crc_);
        }